

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall NTrodeObj::~NTrodeObj(NTrodeObj *this)

{
  NetworkDataType *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__NTrodeObj_005d6258;
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  NetworkDataType::~NetworkDataType(in_RDI);
  return;
}

Assistant:

NTrodeObj::~NTrodeObj() {

}